

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzio.c
# Opt level: O0

size_t luaZ_read(ZIO *z,void *b,size_t n)

{
  int iVar1;
  size_t local_38;
  size_t m;
  size_t n_local;
  void *b_local;
  ZIO *z_local;
  
  m = n;
  n_local = (size_t)b;
  do {
    if (m == 0) {
      return 0;
    }
    if (z->n == 0) {
      iVar1 = luaZ_fill(z);
      if (iVar1 == -1) {
        return m;
      }
      z->n = z->n + 1;
      z->p = z->p + -1;
    }
    if (z->n < m) {
      local_38 = z->n;
    }
    else {
      local_38 = m;
    }
    memcpy((void *)n_local,z->p,local_38);
    z->n = z->n - local_38;
    z->p = z->p + local_38;
    n_local = n_local + local_38;
    m = m - local_38;
  } while( true );
}

Assistant:

size_t luaZ_read(ZIO *z, void *b, size_t n) {
    while (n) {
        size_t m;
        if (z->n == 0) {  /* no bytes in buffer? */
            if (luaZ_fill(z) == EOZ)  /* try to read more */
                return n;  /* no more input; return number of missing bytes */
            else {
                z->n++;  /* luaZ_fill consumed first byte; put it back */
                z->p--;
            }
        }
        m = (n <= z->n) ? n : z->n;  /* min. between n and z->n */
        memcpy(b, z->p, m);
        z->n -= m;
        z->p += m;
        b = (char *) b + m;
        n -= m;
    }
    return 0;
}